

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_format(lua_State *L)

{
  char *__s;
  ulong __n;
  size_t sVar1;
  char cVar2;
  int arg;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  ushort **ppuVar9;
  char *pcVar10;
  lua_Integer lVar11;
  void *pvVar12;
  lconv *plVar13;
  undefined1 *puVar14;
  char *__format;
  size_t sVar15;
  byte bVar16;
  char *pcVar17;
  lua_Number lVar18;
  char *local_4b8;
  size_t l;
  undefined4 local_48c;
  char form [32];
  size_t local_460;
  size_t sfl;
  luaL_Buffer b;
  
  local_48c = lua_gettop(L);
  pcVar5 = luaL_checklstring(L,1,&sfl);
  pcVar17 = pcVar5 + sfl;
  luaL_buffinit(L,&b);
  iVar4 = 1;
LAB_00115d1f:
  while( true ) {
    while( true ) {
      if (pcVar17 <= pcVar5) {
        luaL_pushresult(&b);
        return 1;
      }
      cVar2 = *pcVar5;
      if (cVar2 == '%') break;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
        cVar2 = *pcVar5;
      }
      pcVar5 = pcVar5 + 1;
      b.b[b.n] = cVar2;
      b.n = b.n + 1;
    }
    __s = pcVar5 + 1;
    if (pcVar5[1] != '%') break;
    cVar2 = '%';
    if (b.size <= b.n) {
      luaL_prepbuffsize(&b,1);
      cVar2 = *__s;
    }
    pcVar5 = pcVar5 + 2;
    b.b[b.n] = cVar2;
    b.n = b.n + 1;
  }
  local_4b8 = luaL_prepbuffsize(&b,0x78);
  arg = iVar4 + 1;
  if (local_48c <= iVar4) {
    iVar4 = luaL_argerror(L,arg,"no value");
    return iVar4;
  }
  sVar6 = strspn(__s,"-+#0 123456789.");
  __n = sVar6 + 1;
  if (0x15 < __n) {
    luaL_error(L,"invalid format (too long)");
  }
  form[0] = '%';
  memcpy(form + 1,__s,__n);
  form[sVar6 + 2] = '\0';
  cVar2 = __s[sVar6];
  pcVar5 = "-+0 ";
  switch(cVar2) {
  case 'X':
  case 'o':
  case 'x':
    pcVar5 = "-#0";
    goto switchD_00115e6e_caseD_64;
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'r':
  case 't':
  case 'v':
  case 'w':
    goto switchD_00115e6e_caseD_59;
  case 'a':
    goto switchD_00115e6e_caseD_61;
  case 'c':
    checkformat(L,form,"-",0);
    uVar7 = luaL_checkinteger(L,arg);
    uVar3 = snprintf(local_4b8,0x78,form,uVar7 & 0xffffffff);
    break;
  case 'd':
  case 'i':
    goto switchD_00115e6e_caseD_64;
  case 'e':
  case 'g':
switchD_00115e6e_caseD_65:
    sVar6 = 0x78;
    goto LAB_001161f1;
  case 'f':
    sVar6 = 0x1a2;
    local_4b8 = luaL_prepbuffsize(&b,0x1a2);
LAB_001161f1:
    lVar18 = luaL_checknumber(L,arg);
    checkformat(L,form,"-+#0 ",1);
    addlenmod(form,"");
    goto LAB_0011624b;
  case 'p':
    pcVar5 = (char *)lua_topointer(L,arg);
    checkformat(L,form,"-",0);
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(form);
      form[sVar6 - 1] = 's';
      pcVar5 = "(null)";
    }
    uVar3 = snprintf(local_4b8,0x78,form,pcVar5);
    break;
  case 'q':
    if (form[2] != '\0') {
      iVar4 = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
      return iVar4;
    }
    uVar3 = lua_type(L,arg);
    if (uVar3 < 2) {
      uVar3 = 0;
      luaL_tolstring(L,arg,(size_t *)0x0);
      luaL_addvalue(&b);
    }
    else {
      if (uVar3 != 3) {
        if (uVar3 == 4) {
          pcVar5 = lua_tolstring(L,arg,&local_460);
          sVar1 = local_460;
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
          }
          b.b[b.n] = '\"';
          b.n = b.n + 1;
          for (sVar15 = 0; sVar1 != sVar15; sVar15 = sVar15 + 1) {
            bVar16 = pcVar5[sVar15];
            uVar7 = (ulong)bVar16;
            if (((uVar7 == 10) || (bVar16 == 0x5c)) || (bVar16 == 0x22)) {
              sVar8 = b.n;
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
                sVar8 = b.n;
              }
              b.n = sVar8 + 1;
              b.b[sVar8] = '\\';
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
              }
              b.b[b.n] = pcVar5[sVar15];
              b.n = b.n + 1;
            }
            else {
              ppuVar9 = __ctype_b_loc();
              if (((*ppuVar9)[uVar7] & 2) == 0) {
                if (b.size <= b.n) {
                  luaL_prepbuffsize(&b,1);
                  bVar16 = pcVar5[sVar15];
                }
                b.b[b.n] = bVar16;
                b.n = b.n + 1;
              }
              else {
                pcVar10 = "\\%03d";
                if (((*ppuVar9)[(byte)pcVar5[sVar15 + 1]] >> 0xb & 1) == 0) {
                  pcVar10 = "\\%d";
                }
                snprintf((char *)&l,10,pcVar10,uVar7);
                luaL_addstring(&b,(char *)&l);
              }
            }
          }
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
          }
          b.b[b.n] = '\"';
          b.n = b.n + 1;
          goto LAB_001163b0;
        }
        luaL_argerror(L,arg,"value has no literal form");
        goto LAB_00116418;
      }
      pcVar5 = luaL_prepbuffsize(&b,0x78);
      iVar4 = lua_isinteger(L,arg);
      if (iVar4 == 0) {
        lVar18 = lua_tonumberx(L,arg,(int *)0x0);
        pcVar10 = "1e9999";
        if (((INFINITY <= lVar18) || (pcVar10 = "-1e9999", lVar18 <= -INFINITY)) ||
           (pcVar10 = "(0/0)", NAN(lVar18))) {
          __format = "%s";
          goto LAB_00116405;
        }
        uVar3 = snprintf(pcVar5,0x78,"%a","(0/0)");
        pvVar12 = memchr(pcVar5,0x2e,(ulong)uVar3);
        if (pvVar12 == (void *)0x0) {
          plVar13 = localeconv();
          puVar14 = (undefined1 *)memchr(pcVar5,(int)*plVar13->decimal_point,(ulong)uVar3);
          if (puVar14 != (undefined1 *)0x0) {
            *puVar14 = 0x2e;
          }
        }
      }
      else {
        pcVar10 = (char *)lua_tointegerx(L,arg,(int *)0x0);
        __format = "%lld";
LAB_00116405:
        uVar3 = snprintf(pcVar5,0x78,__format,pcVar10);
      }
      b.n = b.n + uVar3;
LAB_00116418:
      uVar3 = 0;
    }
    break;
  case 's':
    pcVar5 = luaL_tolstring(L,arg,&l);
    sVar1 = l;
    if (form[2] == '\0') {
      luaL_addvalue(&b);
      goto LAB_00116418;
    }
    sVar6 = strlen(pcVar5);
    if (sVar1 != sVar6) {
      luaL_argerror(L,arg,"string contains zeros");
    }
    checkformat(L,form,"-",1);
    pcVar10 = strchr(form,0x2e);
    if ((pcVar10 == (char *)0x0) && (99 < l)) {
      luaL_addvalue(&b);
LAB_001163b0:
      uVar3 = 0;
    }
    else {
      uVar3 = snprintf(local_4b8,0x78,form,pcVar5);
      lua_settop(L,-2);
    }
    break;
  case 'u':
    pcVar5 = "-0";
    goto switchD_00115e6e_caseD_64;
  default:
    if (cVar2 != 'A') {
      if (cVar2 == 'E') goto switchD_00115e6e_caseD_65;
      sVar6 = 0x78;
      if (cVar2 == 'G') goto LAB_001161f1;
switchD_00115e6e_caseD_59:
      iVar4 = luaL_error(L,"invalid conversion \'%s\' to \'format\'",form);
      return iVar4;
    }
switchD_00115e6e_caseD_61:
    checkformat(L,form,"-+#0 ",1);
    addlenmod(form,"");
    lVar18 = luaL_checknumber(L,arg);
    sVar6 = 0x78;
LAB_0011624b:
    uVar3 = snprintf(local_4b8,sVar6,form,lVar18);
  }
LAB_001162b5:
  pcVar5 = __s + __n;
  b.n = b.n + uVar3;
  iVar4 = arg;
  goto LAB_00115d1f;
switchD_00115e6e_caseD_64:
  lVar11 = luaL_checkinteger(L,arg);
  checkformat(L,form,pcVar5,1);
  addlenmod(form,"ll");
  uVar3 = snprintf(local_4b8,0x78,form,lVar11);
  goto LAB_001162b5;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  const char *flags;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      unsigned maxitem = MAX_ITEM;  /* maximum length for the result */
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put result */
      int nb = 0;  /* number of bytes in result */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = getformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          checkformat(L, form, L_FMTFLAGSC, 0);
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
          flags = L_FMTFLAGSI;
          goto intcase;
        case 'u':
          flags = L_FMTFLAGSU;
          goto intcase;
        case 'o': case 'x': case 'X':
          flags = L_FMTFLAGSX;
         intcase: {
          lua_Integer n = luaL_checkinteger(L, arg);
          checkformat(L, form, flags, 1);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          checkformat(L, form, L_FMTFLAGSC, 0);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            checkformat(L, form, L_FMTFLAGSC, 1);
            if (strchr(form, '.') == NULL && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(cast_uint(nb) < maxitem);
      luaL_addsize(&b, cast_uint(nb));
    }
  }
  luaL_pushresult(&b);
  return 1;
}